

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidgetPrivate::dataChanged
          (QTableWidgetPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  long in_RDI;
  SortOrder order;
  int column;
  int in_stack_00000070;
  int in_stack_00000074;
  SortOrder in_stack_00000078;
  int in_stack_0000007c;
  QTableModel *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if ((((*(byte *)(in_RDI + 0x640) & 1) != 0) &&
      (bVar1 = QModelIndex::isValid
                         ((QModelIndex *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)), bVar1)) &&
     (bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)), bVar1)) {
    iVar2 = QHeaderView::sortIndicatorSection
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
    iVar3 = QModelIndex::column(in_RSI);
    if ((iVar3 <= iVar2) && (iVar3 = QModelIndex::column(in_RDX), iVar2 <= iVar3)) {
      QHeaderView::sortIndicatorOrder
                ((QHeaderView *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      tableModel((QTableWidgetPrivate *)0x8d9c10);
      QModelIndex::row(in_RSI);
      QModelIndex::row(in_RDX);
      QTableModel::ensureSorted
                (in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,
                 in_stack_00000070);
    }
  }
  return;
}

Assistant:

void QTableWidgetPrivate::dataChanged(const QModelIndex &topLeft,
                                      const QModelIndex &bottomRight)
{
    if (sortingEnabled && topLeft.isValid() && bottomRight.isValid()) {
        int column = horizontalHeader->sortIndicatorSection();
        if (column >= topLeft.column() && column <= bottomRight.column()) {
            Qt::SortOrder order = horizontalHeader->sortIndicatorOrder();
            tableModel()->ensureSorted(column, order, topLeft.row(), bottomRight.row());
        }
    }
}